

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetBlend
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  PClass *pPVar6;
  int iVar7;
  undefined4 extraout_var;
  DFlashFader *this;
  uint uVar9;
  AActor *who;
  char *pcVar10;
  uint uVar11;
  bool bVar12;
  PClass *pPVar8;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
    goto LAB_003d6c5d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d6c4d:
    pcVar10 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d6c5d:
    __assert_fail(pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xe59,
                  "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  who = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (who == (AActor *)0x0) goto LAB_003d6ad8;
    pPVar8 = (who->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar7 = (**(who->super_DThinker).super_DObject._vptr_DObject)(who);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar7);
      (who->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar12 = pPVar8 != (PClass *)0x0;
    if (pPVar8 != pPVar6 && bVar12) {
      do {
        pPVar8 = pPVar8->ParentClass;
        bVar12 = pPVar8 != (PClass *)0x0;
        if (pPVar8 == pPVar6) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    if (!bVar12) {
      pcVar10 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d6c5d;
    }
  }
  else {
    if (who != (AActor *)0x0) goto LAB_003d6c4d;
LAB_003d6ad8:
    who = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar10 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if (numparam < 3) {
        pcVar10 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          if (numparam == 3) {
            pcVar10 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              uVar2 = param[1].field_0.i;
              dVar1 = param[2].field_0.f;
              iVar7 = param[3].field_0.i;
              if ((uint)numparam < 5) {
                param = defaultparam->Array;
                if (param[4].field_0.field_3.Type == '\0') goto LAB_003d6b59;
                pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
LAB_003d6b59:
                  uVar3 = param[4].field_0.i;
                  bVar12 = uVar2 == 0xffffffff;
                  uVar11 = uVar2 >> 0x10 & 0xff;
                  if (bVar12) {
                    uVar11 = 0;
                  }
                  uVar9 = uVar2 >> 8 & 0xff;
                  if (bVar12) {
                    uVar9 = 0;
                  }
                  uVar2 = uVar2 & 0xff;
                  if (bVar12) {
                    uVar2 = 0;
                  }
                  uVar4 = uVar3 >> 0x10;
                  uVar5 = uVar3 >> 8;
                  if (uVar3 + 1 < 0x1000001) {
                    uVar3 = uVar2;
                    uVar4 = uVar11;
                    uVar5 = uVar9;
                  }
                  this = (DFlashFader *)
                         M_Malloc_Dbg(0x68,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                                      ,0x1f9);
                  DFlashFader::DFlashFader
                            (this,(float)uVar11 / 255.0,(float)uVar9 / 255.0,(float)uVar2 / 255.0,
                             (float)dVar1,(float)(uVar4 & 0xff) / 255.0,
                             (float)(uVar5 & 0xff) / 255.0,(float)(uVar3 & 0xff) / 255.0,0.0,
                             (float)iVar7 / 35.0,who);
                  return 0;
                }
                pcVar10 = "(param[paramnum]).Type == REGT_INT";
              }
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0xe5d,
                            "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar10 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xe5c,
                        "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar10 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xe5b,
                    "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar10 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xe5a,
                "int AF_AActor_A_SetBlend(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetBlend)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_COLOR		(color);
	PARAM_FLOAT		(alpha);
	PARAM_INT		(tics);
	PARAM_COLOR_DEF	(color2);

	if (color == MAKEARGB(255,255,255,255))
		color = 0;
	if (color2 == MAKEARGB(255,255,255,255))
		color2 = 0;
	if (color2.a == 0)
		color2 = color;

	new DFlashFader(color.r/255.f, color.g/255.f, color.b/255.f, float(alpha),
					color2.r/255.f, color2.g/255.f, color2.b/255.f, 0,
					float(tics)/TICRATE, self);
	return 0;
}